

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  uint8_t uVar6;
  roaring_array_t *prVar7;
  int *c;
  int *piVar8;
  uint8_t uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t cap;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint32_t uVar20;
  bool bVar21;
  uint8_t result_type;
  uint8_t local_55;
  uint32_t local_54;
  roaring_array_t *local_50;
  uint32_t local_44;
  roaring_bitmap_t *local_40;
  roaring_bitmap_t *local_38;
  
  local_55 = '\0';
  uVar20 = (x1->high_low_container).size;
  local_54 = (x2->high_low_container).size;
  cap = local_54;
  if ((int)uVar20 < (int)local_54) {
    cap = uVar20;
  }
  local_50 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  if ((((x1->high_low_container).flags & 1) == 0) || (((x2->high_low_container).flags & 1) == 0)) {
    local_50->flags = local_50->flags & 0xfe;
  }
  else {
    local_50->flags = local_50->flags | 1;
  }
  if (0 < (int)local_54 && 0 < (int)uVar20) {
    uVar19 = 0;
    uVar14 = 0;
    local_44 = uVar20;
    local_40 = x2;
    local_38 = x1;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar16 = uVar19 & 0xffff;
      uVar1 = puVar3[uVar16];
      puVar4 = (x2->high_low_container).keys;
      uVar17 = uVar14 & 0xffff;
      uVar2 = puVar4[uVar17];
      if (uVar1 == uVar2) {
        c = (int *)container_and((x1->high_low_container).containers[uVar16],
                                 (x1->high_low_container).typecodes[uVar16],
                                 (x2->high_low_container).containers[uVar17],
                                 (x2->high_low_container).typecodes[uVar17],&local_55);
        prVar7 = local_50;
        uVar6 = local_55;
        piVar8 = c;
        uVar9 = local_55;
        if (local_55 == '\x04') {
          uVar9 = (uint8_t)c[2];
          if (uVar9 == '\x04') {
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          piVar8 = *(int **)c;
        }
        if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
          bVar21 = 0 < *piVar8;
        }
        else {
          if (uVar9 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (*piVar8 == -1) {
            if (**(long **)(piVar8 + 2) == 0) {
              uVar11 = 0xffffffffffffffff;
              do {
                if (uVar11 == 0x3fe) {
                  uVar13 = 0x3ff;
                  break;
                }
                uVar13 = uVar11 + 1;
                lVar5 = uVar11 + 2;
                uVar11 = uVar13;
              } while ((*(long **)(piVar8 + 2))[lVar5] == 0);
              bVar21 = 0x3fe < uVar13;
            }
            else {
              bVar21 = false;
            }
          }
          else {
            bVar21 = *piVar8 == 0;
          }
          bVar21 = (bool)(bVar21 ^ 1);
        }
        if (bVar21) {
          extend_array(local_50,1);
          iVar18 = prVar7->size;
          prVar7->keys[iVar18] = uVar1;
          prVar7->containers[iVar18] = c;
          prVar7->typecodes[iVar18] = uVar6;
          prVar7->size = prVar7->size + 1;
        }
        else {
          container_free(c,local_55);
        }
        x2 = local_40;
        x1 = local_38;
        uVar20 = local_44;
        uVar15 = uVar19 + 1;
        uVar12 = uVar14 + 1;
      }
      else if (uVar1 < uVar2) {
        uVar17 = (x1->high_low_container).size;
        uVar16 = uVar19 + 1;
        uVar15 = uVar16;
        uVar12 = uVar14;
        if (((int)uVar16 < (int)uVar17) && (puVar3[(int)uVar16] < uVar2)) {
          uVar19 = uVar19 + 2;
          iVar18 = 1;
          if ((int)uVar19 < (int)uVar17) {
            iVar10 = 1;
            do {
              iVar18 = iVar10;
              if (uVar2 <= puVar3[(int)uVar19]) goto LAB_00114d7c;
              iVar18 = iVar10 * 2;
              uVar19 = uVar16 + iVar10 * 2;
              iVar10 = iVar18;
            } while ((int)uVar19 < (int)uVar17);
          }
          uVar19 = uVar17 - 1;
LAB_00114d7c:
          uVar15 = uVar19;
          if (((puVar3[(int)uVar19] != uVar2) && (uVar15 = uVar17, uVar2 <= puVar3[(int)uVar19])) &&
             (uVar15 = uVar19, (iVar18 >> 1) + uVar16 + 1 != uVar19)) {
            uVar16 = (iVar18 >> 1) + uVar16;
            do {
              uVar15 = (int)(uVar16 + uVar19) >> 1;
              if (puVar3[(int)uVar15] == uVar2) break;
              if (uVar2 <= puVar3[(int)uVar15]) {
                uVar19 = uVar15;
                uVar15 = uVar16;
              }
              uVar16 = uVar15;
              uVar15 = uVar19;
            } while (uVar16 + 1 != uVar19);
          }
        }
      }
      else {
        uVar17 = (x2->high_low_container).size;
        uVar16 = uVar14 + 1;
        uVar15 = uVar19;
        uVar12 = uVar16;
        if (((int)uVar16 < (int)uVar17) && (puVar4[(int)uVar16] < uVar1)) {
          uVar14 = uVar14 + 2;
          iVar18 = 1;
          if ((int)uVar14 < (int)uVar17) {
            iVar10 = 1;
            do {
              iVar18 = iVar10;
              if (uVar1 <= puVar4[(int)uVar14]) goto LAB_00114de3;
              iVar18 = iVar10 * 2;
              uVar14 = uVar16 + iVar10 * 2;
              iVar10 = iVar18;
            } while ((int)uVar14 < (int)uVar17);
          }
          uVar14 = uVar17 - 1;
LAB_00114de3:
          uVar12 = uVar14;
          if (((puVar4[(int)uVar14] != uVar1) && (uVar12 = uVar17, uVar1 <= puVar4[(int)uVar14])) &&
             (uVar12 = uVar14, (iVar18 >> 1) + uVar16 + 1 != uVar14)) {
            uVar16 = (iVar18 >> 1) + uVar16;
            do {
              uVar12 = (int)(uVar16 + uVar14) >> 1;
              if (puVar4[(int)uVar12] == uVar1) break;
              if (uVar1 <= puVar4[(int)uVar12]) {
                uVar14 = uVar12;
                uVar12 = uVar16;
              }
              uVar16 = uVar12;
              uVar12 = uVar14;
            } while (uVar16 + 1 != uVar14);
          }
        }
      }
      uVar14 = uVar12;
      uVar19 = uVar15;
    } while (((int)uVar19 < (int)uVar20) && ((int)uVar14 < (int)local_54));
  }
  return (roaring_bitmap_t *)local_50;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}